

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::hilbert_split
          (tetgenmesh *this,point *vertexarray,int arraysize,int gc0,int gc1,double bxmin,
          double bxmax,double bymin,double bymax,double bzmin,double bzmax)

{
  point pdVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  double dVar9;
  
  uVar4 = (gc1 ^ gc0) >> 1;
  if ((uint)(gc1 ^ gc0) < 2) {
    dVar9 = bxmin + bxmax;
  }
  else if (uVar4 == 1) {
    dVar9 = bymin + bymax;
  }
  else {
    dVar9 = bzmin + bzmax;
  }
  dVar9 = dVar9 * 0.5;
  uVar6 = arraysize - 1;
  if (((uint)gc0 >> (uVar4 & 0x1f) & 1) == 0) {
    iVar5 = 0;
    do {
      lVar8 = (long)iVar5;
      iVar3 = arraysize;
      if (arraysize < iVar5) {
        iVar3 = iVar5;
      }
      for (; iVar5 = iVar3, lVar8 < arraysize; lVar8 = lVar8 + 1) {
        if (dVar9 <= vertexarray[lVar8][(int)uVar4]) {
          iVar5 = (int)lVar8;
          break;
        }
        iVar3 = iVar5;
      }
      uVar7 = 0xffffffff;
      if ((int)uVar6 < -1) {
        uVar7 = uVar6;
      }
      while ((uVar2 = uVar7, -1 < (int)uVar6 &&
             (uVar2 = uVar6,
             dVar9 < vertexarray[uVar6][(int)uVar4] || dVar9 == vertexarray[uVar6][(int)uVar4]))) {
        uVar6 = uVar6 - 1;
      }
      uVar6 = uVar2;
      if (iVar5 == uVar6 + 1) {
        return iVar5;
      }
      pdVar1 = vertexarray[iVar5];
      vertexarray[iVar5] = vertexarray[(int)uVar6];
      vertexarray[(int)uVar6] = pdVar1;
    } while( true );
  }
  iVar5 = 0;
  do {
    lVar8 = (long)iVar5;
    iVar3 = arraysize;
    if (arraysize < iVar5) {
      iVar3 = iVar5;
    }
    for (; iVar5 = iVar3, lVar8 < arraysize; lVar8 = lVar8 + 1) {
      if (vertexarray[lVar8][(int)uVar4] <= dVar9) {
        iVar5 = (int)lVar8;
        break;
      }
      iVar3 = iVar5;
    }
    uVar7 = 0xffffffff;
    if ((int)uVar6 < -1) {
      uVar7 = uVar6;
    }
    while ((uVar2 = uVar7, -1 < (int)uVar6 &&
           (uVar2 = uVar6, vertexarray[uVar6][(int)uVar4] <= dVar9))) {
      uVar6 = uVar6 - 1;
    }
    uVar6 = uVar2;
    if (iVar5 == uVar6 + 1) {
      return iVar5;
    }
    pdVar1 = vertexarray[iVar5];
    vertexarray[iVar5] = vertexarray[(int)uVar6];
    vertexarray[(int)uVar6] = pdVar1;
  } while( true );
}

Assistant:

int tetgenmesh::hilbert_split(point* vertexarray,int arraysize,int gc0,int gc1,
                              REAL bxmin, REAL bxmax, REAL bymin, REAL bymax, 
                              REAL bzmin, REAL bzmax)
{
  point swapvert;
  int axis, d;
  REAL split;
  int i, j;


  // Find the current splitting axis. 'axis' is a value 0, or 1, or 2, which 
  //   correspoding to x-, or y- or z-axis.
  axis = (gc0 ^ gc1) >> 1; 

  // Calulate the split position along the axis.
  if (axis == 0) {
    split = 0.5 * (bxmin + bxmax);
  } else if (axis == 1) {
    split = 0.5 * (bymin + bymax);
  } else { // == 2
    split = 0.5 * (bzmin + bzmax);
  }

  // Find the direction (+1 or -1) of the axis. If 'd' is +1, the direction
  //   of the axis is to the positive of the axis, otherwise, it is -1.
  d = ((gc0 & (1<<axis)) == 0) ? 1 : -1;


  // Partition the vertices into left- and right-arrays such that left points
  //   have Hilbert indices lower than the right points.
  i = 0;
  j = arraysize - 1;

  // Partition the vertices into left- and right-arrays.
  if (d > 0) {
    do {
      for (; i < arraysize; i++) {      
        if (vertexarray[i][axis] >= split) break;
      }
      for (; j >= 0; j--) {
        if (vertexarray[j][axis] < split) break;
      }
      // Is the partition finished?
      if (i == (j + 1)) break;
      // Swap i-th and j-th vertices.
      swapvert = vertexarray[i];
      vertexarray[i] = vertexarray[j];
      vertexarray[j] = swapvert;
      // Continue patitioning the array;
    } while (true);
  } else {
    do {
      for (; i < arraysize; i++) {      
        if (vertexarray[i][axis] <= split) break;
      }
      for (; j >= 0; j--) {
        if (vertexarray[j][axis] > split) break;
      }
      // Is the partition finished?
      if (i == (j + 1)) break;
      // Swap i-th and j-th vertices.
      swapvert = vertexarray[i];
      vertexarray[i] = vertexarray[j];
      vertexarray[j] = swapvert;
      // Continue patitioning the array;
    } while (true);
  }

  return i;
}